

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::CalcListClipping
               (int items_count,float items_height,int *out_items_display_start,
               int *out_items_display_end)

{
  float fVar1;
  ImGuiWindow *window;
  ImGuiContext *pIVar2;
  int iVar3;
  bool *pbVar4;
  int iVar5;
  ImGuiContext *g;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ImRect IVar10;
  ImRect rect;
  ImRect local_48;
  float local_38;
  
  pIVar2 = GImGui;
  if (GImGui->LogEnabled == true) {
    *out_items_display_start = 0;
  }
  else {
    window = GImGui->CurrentWindow;
    pbVar4 = &GImGui->CurrentTable->HostSkipItems;
    if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
      pbVar4 = &window->SkipItems;
    }
    if (*pbVar4 == true) {
      *out_items_display_end = 0;
      *out_items_display_start = 0;
      return;
    }
    local_48.Min = (window->ClipRect).Min;
    local_48.Max = (window->ClipRect).Max;
    local_38 = items_height;
    if (GImGui->NavMoveScoringItems == true) {
      ImRect::Add(&local_48,&GImGui->NavScoringNoClipRect);
    }
    if ((pIVar2->NavJustMovedToId != 0) && (window->NavLastIds[0] == pIVar2->NavJustMovedToId)) {
      IVar10 = WindowRectRelToAbs(window,window->NavRectRel);
      if (IVar10.Min.y < local_48.Min.y) {
        local_48.Min = (ImVec2)((ulong)(uint)IVar10.Min.y << 0x20);
      }
      if (local_48.Max.y < IVar10.Max.y) {
        local_48.Max = (ImVec2)((ulong)(uint)IVar10.Max.y << 0x20);
      }
    }
    fVar1 = (window->DC).CursorPos.y;
    auVar8._0_4_ = local_48.Max.y - fVar1;
    auVar8._4_4_ = local_48.Min.y - fVar1;
    auVar8._8_4_ = local_48.Max.y - fVar1;
    auVar8._12_4_ = local_48.Max.y - fVar1;
    auVar9._4_4_ = local_38;
    auVar9._0_4_ = local_38;
    auVar9._8_4_ = local_38;
    auVar9._12_4_ = local_38;
    auVar9 = divps(auVar8,auVar9);
    iVar6 = (int)auVar9._0_4_;
    iVar7 = (int)auVar9._4_4_;
    if (((pIVar2->NavMoveScoringItems == true) && (pIVar2->NavWindow != (ImGuiWindow *)0x0)) &&
       (pIVar2->NavWindow->RootWindowForNav == window->RootWindowForNav)) {
      iVar6 = iVar6 - ((int)-(uint)(pIVar2->NavMoveClipDir == 3) >> 0x1f);
      iVar7 = iVar7 - (uint)(pIVar2->NavMoveClipDir == 2);
    }
    iVar3 = items_count;
    if (iVar7 < items_count) {
      iVar3 = iVar7;
    }
    iVar5 = 0;
    if (-1 < iVar7) {
      iVar5 = iVar3;
    }
    iVar6 = iVar6 + 1;
    if (iVar6 < items_count) {
      items_count = iVar6;
    }
    if (iVar6 < iVar5) {
      items_count = iVar5;
    }
    *out_items_display_start = iVar5;
  }
  *out_items_display_end = items_count;
  return;
}

Assistant:

void ImGui::CalcListClipping(int items_count, float items_height, int* out_items_display_start, int* out_items_display_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.LogEnabled)
    {
        // If logging is active, do not perform any clipping
        *out_items_display_start = 0;
        *out_items_display_end = items_count;
        return;
    }
    if (GetSkipItemForListClipping())
    {
        *out_items_display_start = *out_items_display_end = 0;
        return;
    }

    // We create the union of the ClipRect and the scoring rect which at worst should be 1 page away from ClipRect
    // We don't include g.NavId's rectangle in there (unless g.NavJustMovedToId is set) because the rectangle enlargement can get costly.
    ImRect rect = window->ClipRect;
    if (g.NavMoveScoringItems)
        rect.Add(g.NavScoringNoClipRect);
    if (g.NavJustMovedToId && window->NavLastIds[0] == g.NavJustMovedToId)
        rect.Add(WindowRectRelToAbs(window, window->NavRectRel[0])); // Could store and use NavJustMovedToRectRel

    const ImVec2 pos = window->DC.CursorPos;
    int start = (int)((rect.Min.y - pos.y) / items_height);
    int end = (int)((rect.Max.y - pos.y) / items_height);

    // When performing a navigation request, ensure we have one item extra in the direction we are moving to
    // FIXME: Verify this works with tabbing
    const bool is_nav_request = (g.NavMoveScoringItems && g.NavWindow && g.NavWindow->RootWindowForNav == window->RootWindowForNav);
    if (is_nav_request && g.NavMoveClipDir == ImGuiDir_Up)
        start--;
    if (is_nav_request && g.NavMoveClipDir == ImGuiDir_Down)
        end++;

    start = ImClamp(start, 0, items_count);
    end = ImClamp(end + 1, start, items_count);
    *out_items_display_start = start;
    *out_items_display_end = end;
}